

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ComputeResponse(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
               string *key,vector<unsigned_char,_std::allocator<unsigned_char>_> *cookie,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *clientNonce,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *serverNonce)

{
  CSHA256 *this;
  uchar *puVar1;
  uchar *hash;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  CHMAC_SHA256 computeHash;
  CHMAC_SHA256 local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_30;
  
  local_30 = *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28);
  CHMAC_SHA256::CHMAC_SHA256(&local_100,(uchar *)key,(size_t)cookie);
  hash = (uchar *)operator_new(0x20);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = hash;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = hash + 0x20;
  hash[0] = '\0';
  hash[1] = '\0';
  hash[2] = '\0';
  hash[3] = '\0';
  hash[4] = '\0';
  hash[5] = '\0';
  hash[6] = '\0';
  hash[7] = '\0';
  hash[8] = '\0';
  hash[9] = '\0';
  hash[10] = '\0';
  hash[0xb] = '\0';
  hash[0xc] = '\0';
  hash[0xd] = '\0';
  hash[0xe] = '\0';
  hash[0xf] = '\0';
  hash[0x10] = '\0';
  hash[0x11] = '\0';
  hash[0x12] = '\0';
  hash[0x13] = '\0';
  hash[0x14] = '\0';
  hash[0x15] = '\0';
  hash[0x16] = '\0';
  hash[0x17] = '\0';
  hash[0x18] = '\0';
  hash[0x19] = '\0';
  hash[0x1a] = '\0';
  hash[0x1b] = '\0';
  hash[0x1c] = '\0';
  hash[0x1d] = '\0';
  hash[0x1e] = '\0';
  hash[0x1f] = '\0';
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = hash + 0x20;
  puVar1 = (clientNonce->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this = &local_100.inner;
  CSHA256::Write(this,puVar1,
                 (long)(clientNonce->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar1);
  puVar1 = (serverNonce->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  CSHA256::Write(this,puVar1,
                 (long)(serverNonce->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar1);
  CSHA256::Write(this,(uchar *)*in_R9,in_R9[1] - (long)*in_R9);
  CHMAC_SHA256::Finalize(&local_100,hash);
  if (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28) == local_30)
  {
    return *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<uint8_t> ComputeResponse(const std::string &key, const std::vector<uint8_t> &cookie,  const std::vector<uint8_t> &clientNonce, const std::vector<uint8_t> &serverNonce)
{
    CHMAC_SHA256 computeHash((const uint8_t*)key.data(), key.size());
    std::vector<uint8_t> computedHash(CHMAC_SHA256::OUTPUT_SIZE, 0);
    computeHash.Write(cookie.data(), cookie.size());
    computeHash.Write(clientNonce.data(), clientNonce.size());
    computeHash.Write(serverNonce.data(), serverNonce.size());
    computeHash.Finalize(computedHash.data());
    return computedHash;
}